

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

CPubKey * __thiscall
wallet::LegacyScriptPubKeyMan::GenerateNewSeed
          (CPubKey *__return_storage_ptr__,LegacyScriptPubKeyMan *this)

{
  long lVar1;
  WalletStorage *pWVar2;
  int iVar3;
  long in_FS_OFFSET;
  CKey key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  iVar3 = (*pWVar2->_vptr_WalletStorage[4])(pWVar2,0x100000000);
  if ((char)iVar3 != '\0') {
    __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x4bc,"CPubKey wallet::LegacyScriptPubKeyMan::GenerateNewSeed()");
  }
  GenerateRandomKey(SUB81(&key,0));
  DeriveNewSeed(__return_storage_ptr__,this,&key);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CPubKey LegacyScriptPubKeyMan::GenerateNewSeed()
{
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));
    CKey key = GenerateRandomKey();
    return DeriveNewSeed(key);
}